

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O1

int wally_scriptpubkey_csv_2of2_then_1_from_bytes
              (uchar *bytes,size_t bytes_len,uint32_t csv_blocks,uint32_t flags,uchar *bytes_out,
              size_t len,size_t *written)

{
  uchar *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  size_t sVar8;
  ulong uVar9;
  
  if (csv_blocks == 0) {
    lVar7 = 0;
  }
  else {
    lVar7 = 0;
    uVar5 = (ulong)csv_blocks;
    do {
      uVar9 = uVar5;
      lVar7 = lVar7 + 1;
      uVar5 = uVar9 >> 8;
    } while (0xff < uVar9);
    lVar7 = (ulong)(0x7f < uVar9) + lVar7;
  }
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  iVar6 = -2;
  if (((bytes_out != (uchar *)0x0 && flags == 0) &&
      (csv_blocks - 0x11 < 0xffef && (bytes_len == 0x42 && bytes != (uchar *)0x0))) &&
      written != (size_t *)0x0) {
    if (lVar7 + 0x4eU <= len) {
      bytes_out[0] = 't';
      bytes_out[1] = 0x8c;
      bytes_out[2] = 'c';
      bytes_out[3] = '!';
      uVar2 = *(undefined8 *)(bytes + 8);
      uVar3 = *(undefined8 *)(bytes + 0x10);
      uVar4 = *(undefined8 *)(bytes + 0x18);
      *(undefined8 *)(bytes_out + 4) = *(undefined8 *)bytes;
      *(undefined8 *)(bytes_out + 0xc) = uVar2;
      *(undefined8 *)(bytes_out + 0x14) = uVar3;
      *(undefined8 *)(bytes_out + 0x1c) = uVar4;
      bytes_out[0x24] = bytes[0x20];
      bytes_out[0x25] = 0xad;
      bytes_out[0x26] = 'g';
      bytes_out[0x27] = (uchar)lVar7;
      sVar8 = scriptint_to_bytes((ulong)csv_blocks,bytes_out + 0x28);
      puVar1 = bytes_out + sVar8 + 0x28;
      puVar1[0] = 0xb2;
      puVar1[1] = 'u';
      puVar1[2] = 'h';
      puVar1[3] = '!';
      uVar2 = *(undefined8 *)(bytes + 0x29);
      uVar3 = *(undefined8 *)(bytes + 0x31);
      uVar4 = *(undefined8 *)(bytes + 0x39);
      *(undefined8 *)(bytes_out + sVar8 + 0x2c) = *(undefined8 *)(bytes + 0x21);
      *(undefined8 *)(bytes_out + sVar8 + 0x2c + 8) = uVar2;
      *(undefined8 *)(bytes_out + sVar8 + 0x3c) = uVar3;
      *(undefined8 *)(bytes_out + sVar8 + 0x3c + 8) = uVar4;
      bytes_out[sVar8 + 0x4c] = bytes[0x41];
      bytes_out[sVar8 + 0x4d] = 0xac;
    }
    *written = lVar7 + 0x4eU;
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

int wally_scriptpubkey_csv_2of2_then_1_from_bytes(
    const unsigned char *bytes, size_t bytes_len, uint32_t csv_blocks,
    uint32_t flags, unsigned char *bytes_out, size_t len, size_t *written)
{
    size_t csv_len = scriptint_get_length(csv_blocks);
    size_t script_len = 2 * (EC_PUBLIC_KEY_LEN + 1) + 9 + 1 + csv_len; /* 1 for push */

    if (written)
        *written = 0;

    if (!bytes || bytes_len != 2 * EC_PUBLIC_KEY_LEN ||
        csv_blocks < 17 || csv_blocks > 0xffff || flags || !bytes_out || !written)
        return WALLY_EINVAL;

    if (len < script_len) {
        *written = script_len;
        return WALLY_OK;
    }

    /* The script we create is:
     *     OP_DEPTH OP_1SUB
     *     OP_IF
     *       # The stack contains the main and and recovery signatures.
     *       # Check the main signature then fall through to check the recovery.
     *       <main_pubkey> OP_CHECKSIGVERIFY
     *     OP_ELSE
     *       # The stack contains only the recovery signature.
     *       # Check the CSV time has expired then fall though as above.
     *       <csv_blocks> OP_CHECKSEQUENCEVERIFY OP_DROP
     *     OP_ENDIF
     *     # Check the recovery signature
     *     <recovery_pubkey> OP_CHECKSIG
     */
    *bytes_out++ = OP_DEPTH;
    *bytes_out++ = OP_1SUB;
    *bytes_out++ = OP_IF;
    *bytes_out++ = EC_PUBLIC_KEY_LEN;
    memcpy(bytes_out, bytes, EC_PUBLIC_KEY_LEN);
    bytes_out += EC_PUBLIC_KEY_LEN;
    *bytes_out++ = OP_CHECKSIGVERIFY;
    *bytes_out++ = OP_ELSE;
    *bytes_out++ = csv_len & 0xff;
    bytes_out += scriptint_to_bytes(csv_blocks, bytes_out);
    *bytes_out++ = OP_CHECKSEQUENCEVERIFY;
    *bytes_out++ = OP_DROP;
    *bytes_out++ = OP_ENDIF;
    *bytes_out++ = EC_PUBLIC_KEY_LEN;
    memcpy(bytes_out, bytes + EC_PUBLIC_KEY_LEN, EC_PUBLIC_KEY_LEN);
    bytes_out += EC_PUBLIC_KEY_LEN;
    *bytes_out++ = OP_CHECKSIG;

    *written = script_len;
    return WALLY_OK;
}